

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O1

void __thiscall duckdb::CardinalityEstimator::RemoveEmptyTotalDomains(CardinalityEstimator *this)

{
  pointer pRVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  idx_t iVar4;
  pointer pRVar5;
  long lVar6;
  iterator __first;
  pointer pRVar7;
  
  pRVar7 = (this->relations_to_tdoms).
           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->relations_to_tdoms).
           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pRVar1 - (long)pRVar7 >> 9;
  pRVar5 = pRVar7;
  if (0 < lVar6) {
    pRVar5 = (pointer)((long)&(pRVar7->equivalent_relations)._M_h._M_buckets +
                      ((long)pRVar1 - (long)pRVar7 & 0xfffffffffffffe00U));
    lVar6 = lVar6 + 1;
    __first._M_current = pRVar7 + 2;
    do {
      if (__first._M_current[-2].equivalent_relations._M_h._M_element_count == 0) {
        __first._M_current = __first._M_current + -2;
        goto LAB_00d1e82f;
      }
      if (__first._M_current[-1].equivalent_relations._M_h._M_element_count == 0) {
        __first._M_current = __first._M_current + -1;
        goto LAB_00d1e82f;
      }
      if (((__first._M_current)->equivalent_relations)._M_h._M_element_count == 0)
      goto LAB_00d1e82f;
      if (__first._M_current[1].equivalent_relations._M_h._M_element_count == 0) {
        __first._M_current = __first._M_current + 1;
        goto LAB_00d1e82f;
      }
      lVar6 = lVar6 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pRVar1 - (long)pRVar5 >> 7;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      __first._M_current = pRVar1;
      if ((lVar6 != 3) ||
         (__first._M_current = pRVar5, (pRVar5->equivalent_relations)._M_h._M_element_count == 0))
      goto LAB_00d1e82f;
      pRVar5 = pRVar5 + 1;
    }
    __first._M_current = pRVar5;
    if ((pRVar5->equivalent_relations)._M_h._M_element_count == 0) goto LAB_00d1e82f;
    pRVar5 = pRVar5 + 1;
  }
  __first._M_current = pRVar5;
  if ((pRVar5->equivalent_relations)._M_h._M_element_count != 0) {
    __first._M_current = pRVar1;
  }
LAB_00d1e82f:
  pRVar7 = __first._M_current + 1;
  if (pRVar7 != pRVar1 && __first._M_current != pRVar1) {
    do {
      if ((pRVar7->equivalent_relations)._M_h._M_element_count != 0) {
        ::std::
        _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::_M_move_assign((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)__first._M_current,pRVar7);
        (__first._M_current)->has_tdom_hll = pRVar7->has_tdom_hll;
        uVar2 = *(undefined4 *)((long)&pRVar7->tdom_hll + 4);
        iVar4 = pRVar7->tdom_no_hll;
        uVar3 = *(undefined4 *)((long)&pRVar7->tdom_no_hll + 4);
        *(int *)&(__first._M_current)->tdom_hll = (int)pRVar7->tdom_hll;
        *(undefined4 *)((long)&(__first._M_current)->tdom_hll + 4) = uVar2;
        *(int *)&(__first._M_current)->tdom_no_hll = (int)iVar4;
        *(undefined4 *)((long)&(__first._M_current)->tdom_no_hll + 4) = uVar3;
        ::std::
        vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ::_M_move_assign(&((__first._M_current)->filters).
                          super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                         ,&pRVar7->filters);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(__first._M_current)->column_names,&pRVar7->column_names);
        __first._M_current = __first._M_current + 1;
      }
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != pRVar1);
  }
  ::std::vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>::_M_erase
            ((vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_> *)this,
             __first,(this->relations_to_tdoms).
                     super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                     .
                     super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void CardinalityEstimator::RemoveEmptyTotalDomains() {
	auto remove_start = std::remove_if(relations_to_tdoms.begin(), relations_to_tdoms.end(),
	                                   [](RelationsToTDom &r_2_tdom) { return r_2_tdom.equivalent_relations.empty(); });
	relations_to_tdoms.erase(remove_start, relations_to_tdoms.end());
}